

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
ipx::Model::DualizeBackBasicSolution
          (Model *this,Vector *x_solver,Vector *y_solver,Vector *z_solver,Vector *x_user,
          Vector *slack_user,Vector *y_user,Vector *z_user)

{
  bool bVar1;
  double *pdVar2;
  reference piVar3;
  valarray<double> *__va;
  valarray<double> *in_RCX;
  valarray<double> *in_RSI;
  size_t __i;
  Model *in_RDI;
  valarray<double> *in_R9;
  valarray<double> *in_stack_00000010;
  Int j;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  Int k;
  Int i;
  Int n;
  Int m;
  valarray<double> *in_stack_ffffffffffffff18;
  valarray<double> *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  Int IVar4;
  undefined8 in_stack_ffffffffffffff40;
  int iVar5;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  Int IVar6;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  valarray<double> *in_stack_ffffffffffffff60;
  double dVar7;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  vector<int,_std::allocator<int>_> *local_50;
  int local_48;
  int local_44;
  _UnClos<std::__negate,_std::_ValArray,_double> local_40;
  Int local_38;
  Int local_34;
  valarray<double> *local_30;
  valarray<double> *local_20;
  valarray<double> *local_10;
  
  local_30 = in_R9;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_34 = rows(in_RDI);
  local_38 = cols(in_RDI);
  iVar5 = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  if ((in_RDI->dualized_ & 1U) == 0) {
    __va = (valarray<double> *)std::begin<double>(in_stack_ffffffffffffff20);
    std::begin<double>(__va);
    std::copy_n<double_const*,int,double*>
              ((double *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),iVar5,
               (double *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    std::begin<double>(__va);
    IVar4 = in_RDI->num_constr_;
    std::begin<double>(__va);
    std::copy_n<double_const*,int,double*>
              ((double *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),iVar5,
               (double *)CONCAT44(IVar4,in_stack_ffffffffffffff38));
    pdVar2 = std::begin<double>(__va);
    iVar5 = (int)((ulong)pdVar2 >> 0x20);
    IVar6 = in_RDI->num_constr_;
    std::begin<double>(__va);
    std::copy_n<double_const*,int,double*>
              ((double *)CONCAT44(IVar6,in_stack_ffffffffffffff48),iVar5,
               (double *)CONCAT44(IVar4,in_stack_ffffffffffffff38));
    std::begin<double>(__va);
    std::begin<double>(__va);
    std::copy_n<double_const*,int,double*>
              ((double *)CONCAT44(IVar6,in_stack_ffffffffffffff48),iVar5,
               (double *)CONCAT44(IVar4,in_stack_ffffffffffffff38));
  }
  else {
    local_40.super__UnBase<std::__negate,_std::valarray<double>_>._M_expr =
         (_UnBase<std::__negate,_std::valarray<double>_>)
         std::valarray<double>::operator-(in_stack_ffffffffffffff18);
    std::valarray<double>::operator=
              (in_stack_ffffffffffffff60,
               (_Expr<std::__detail::_UnClos<std::__negate,_std::_ValArray,_double>,_double> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    for (local_44 = 0; iVar5 = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
        local_44 < in_RDI->num_constr_; local_44 = local_44 + 1) {
      pdVar2 = std::valarray<double>::operator[](local_20,(long)local_44);
      dVar7 = *pdVar2;
      pdVar2 = std::valarray<double>::operator[](local_30,(long)local_44);
      *pdVar2 = -dVar7;
    }
    std::begin<double>(in_stack_ffffffffffffff20);
    std::begin<double>(in_stack_ffffffffffffff20);
    std::copy_n<double_const*,int,double*>
              ((double *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),iVar5,
               (double *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    std::begin<double>(in_stack_ffffffffffffff20);
    std::begin<double>(in_stack_ffffffffffffff20);
    std::copy_n<double_const*,int,double*>
              ((double *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),iVar5,
               (double *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_48 = in_RDI->num_constr_;
    local_50 = &in_RDI->boxed_vars_;
    local_58._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff18);
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff18);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_ffffffffffffff20,
                              (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_ffffffffffffff18), bVar1) {
      piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_58);
      iVar5 = *piVar3;
      __i = (size_t)local_48;
      local_48 = local_48 + 1;
      pdVar2 = std::valarray<double>::operator[](local_10,__i);
      dVar7 = *pdVar2;
      pdVar2 = std::valarray<double>::operator[](in_stack_00000010,(long)iVar5);
      *pdVar2 = *pdVar2 - dVar7;
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_58);
    }
  }
  return;
}

Assistant:

void Model::DualizeBackBasicSolution(const Vector& x_solver,
                                     const Vector& y_solver,
                                     const Vector& z_solver,
                                     Vector& x_user,
                                     Vector& slack_user,
                                     Vector& y_user,
                                     Vector& z_user) const {
    const Int m = rows();
    const Int n = cols();

    if (dualized_) {
        assert(num_var_ == m);
        assert(num_constr_ + (Int)boxed_vars_.size() == n);
        x_user = -y_solver;
        for (Int i = 0; i < num_constr_; i++)
            slack_user[i] = -z_solver[i];
        std::copy_n(std::begin(x_solver), num_constr_, std::begin(y_user));
        std::copy_n(std::begin(x_solver) + n, num_var_, std::begin(z_user));
        Int k = num_constr_;
        for (Int j : boxed_vars_)
            z_user[j] -= x_solver[k++];
        assert(k == n);
    }
    else {
        assert(num_constr_ == m);
        assert(num_var_ == n);
        std::copy_n(std::begin(x_solver), num_var_, std::begin(x_user));
        std::copy_n(std::begin(x_solver) + n, num_constr_,
                    std::begin(slack_user));
        std::copy_n(std::begin(y_solver), num_constr_, std::begin(y_user));
        std::copy_n(std::begin(z_solver), num_var_, std::begin(z_user));
    }
}